

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_CanonicalizeDescriptors_Test::TestBody(TypeTest_CanonicalizeDescriptors_Test *this)

{
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar3;
  reference pvVar4;
  char *in_R9;
  Entry EVar5;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  optional<wasm::HeapType> other_01;
  optional<wasm::HeapType> other_02;
  optional<wasm::HeapType> other_03;
  optional<wasm::HeapType> other_04;
  optional<wasm::HeapType> other_05;
  optional<wasm::HeapType> other_06;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_4;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_3;
  Message local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_2;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_1;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_310;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Entry local_2a8;
  uintptr_t local_298;
  Entry local_290;
  TypeBuilder *local_280;
  Entry local_278;
  uintptr_t local_268;
  Entry local_260;
  TypeBuilder *local_250;
  Entry local_248;
  uintptr_t local_238;
  Entry local_230;
  TypeBuilder *local_220;
  Entry local_218;
  uintptr_t local_208;
  Entry local_200;
  anon_class_8_1_911e227b local_1f0;
  anon_class_8_1_911e227b translate;
  undefined1 local_1d8 [12];
  Entry local_1c8;
  Entry local_1b8;
  undefined1 local_1a8 [12];
  Entry local_198;
  Entry local_188;
  undefined1 local_178 [12];
  Entry local_168;
  Entry local_158;
  undefined1 local_148 [12];
  Entry local_138;
  Entry local_128;
  undefined1 local_118 [12];
  Entry local_108;
  Entry local_f8;
  undefined1 local_e8 [12];
  Entry local_d8;
  Entry local_c8;
  undefined1 local_b8 [12];
  Entry local_a8;
  Entry local_98;
  undefined1 local_88 [12];
  Entry local_78;
  Entry local_68;
  Struct local_58;
  int local_38;
  int i_1;
  int local_24;
  int i;
  TypeBuilder builder;
  int groupSize;
  int numGroups;
  TypeTest_CanonicalizeDescriptors_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._4_4_ = 3;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 4;
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffffe0,0xc);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    ::wasm::TypeBuilder::createRecGroup((ulong)&stack0xffffffffffffffe0,(long)(local_24 << 2));
  }
  for (local_38 = 0; local_38 < 0xc; local_38 = local_38 + 1) {
    local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::wasm::Struct::Struct(&local_58);
    EVar5 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,(long)local_38);
    local_68 = EVar5;
    ::wasm::TypeBuilder::Entry::operator=(&local_68,&local_58);
    ::wasm::Struct::~Struct(&local_58);
  }
  local_78 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,0);
  local_98 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,1);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_88,&local_98);
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_88._0_8_;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_88[8];
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_88._9_3_;
  ::wasm::TypeBuilder::Entry::descriptor(&local_78,other);
  local_a8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,1);
  local_c8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,0);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_b8,&local_c8);
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_b8._0_8_;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_b8[8];
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_b8._9_3_;
  ::wasm::TypeBuilder::Entry::describes(&local_a8,other_00);
  local_d8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,2);
  local_f8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,3);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_e8,&local_f8);
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_e8._0_8_;
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_e8[8];
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_e8._9_3_;
  ::wasm::TypeBuilder::Entry::descriptor(&local_d8,other_01);
  local_108 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,3);
  local_128 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,2);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_118,&local_128);
  other_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_118._0_8_;
  other_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_118[8];
  other_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_118._9_3_;
  ::wasm::TypeBuilder::Entry::describes(&local_108,other_02);
  local_138 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,4);
  local_158 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,7);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_148,&local_158);
  other_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_148._0_8_;
  other_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_148[8];
  other_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_148._9_3_;
  ::wasm::TypeBuilder::Entry::descriptor(&local_138,other_03);
  local_168 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,5);
  local_188 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,6);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_178,&local_188);
  other_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_178._0_8_;
  other_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_178[8];
  other_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_178._9_3_;
  ::wasm::TypeBuilder::Entry::descriptor(&local_168,other_04);
  local_198 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,6);
  local_1b8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,5);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_1a8,&local_1b8);
  other_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1a8._0_8_;
  other_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1a8[8];
  other_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1a8._9_3_;
  ::wasm::TypeBuilder::Entry::describes(&local_198,other_05);
  local_1c8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,7);
  EVar5 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,4);
  translate.builder = EVar5.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_1d8,(Entry *)&translate);
  other_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1d8._0_8_;
  other_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1d8[8];
  other_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1d8._9_3_;
  ::wasm::TypeBuilder::Entry::describes(&local_1c8,other_06);
  local_1f0.builder = (TypeBuilder *)&stack0xffffffffffffffe0;
  local_200 = ::wasm::TypeBuilder::operator[](local_1f0.builder,8);
  local_218 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,0);
  local_208 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_218);
  local_220 = local_1f0.builder;
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeDescriptors_Test::TestBody()::__0>
            (&local_200,(HeapType)local_208,local_1f0);
  local_230 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,9);
  local_248 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,1);
  local_238 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_248);
  local_250 = local_1f0.builder;
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeDescriptors_Test::TestBody()::__0>
            (&local_230,(HeapType)local_238,local_1f0);
  local_260 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,10);
  local_278 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,2);
  local_268 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_278);
  local_280 = local_1f0.builder;
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeDescriptors_Test::TestBody()::__0>
            (&local_260,(HeapType)local_268,local_1f0);
  local_290 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,0xb);
  local_2a8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&stack0xffffffffffffffe0,3);
  local_298 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_2a8);
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeDescriptors_Test::TestBody()::__0>
            (&local_290,(HeapType)local_298,local_1f0);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_2e0,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_310,(internal *)local_2e0,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x23f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  if (bVar1) {
    __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,__x);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,8);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_340,"built[0]","built[8]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
    if (!bVar1) {
      testing::Message::Message(&local_348);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x242,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_348);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_348);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,9);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_360,"built[1]","built[9]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
    if (!bVar1) {
      testing::Message::Message(&local_368);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x243,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_368);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_368);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,10);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_380,"built[2]","built[10]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
    if (!bVar1) {
      testing::Message::Message(&local_388);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x244,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_388);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_388);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,3);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0xb);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_3a0,"built[3]","built[11]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
    if (!bVar1) {
      testing::Message::Message(&local_3a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x245,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_3a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,0);
    local_3c8 = ::wasm::HeapType::getRecGroup();
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,4);
    local_3d0 = ::wasm::HeapType::getRecGroup();
    testing::internal::CmpHelperNE<wasm::RecGroup,wasm::RecGroup>
              ((internal *)local_3c0,"built[0].getRecGroup()","built[4].getRecGroup()",
               (RecGroup *)&local_3c8,(RecGroup *)&local_3d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_3e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x247,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_3e0);
      testing::Message::~Message(&local_3d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

TEST_F(TypeTest, CanonicalizeDescriptors) {
  constexpr int numGroups = 3;
  constexpr int groupSize = 4;
  TypeBuilder builder(numGroups * groupSize);

  for (int i = 0; i < numGroups; ++i) {
    builder.createRecGroup(i * groupSize, groupSize);
  }
  for (int i = 0; i < numGroups * groupSize; ++i) {
    builder[i] = Struct();
  }

  // A B A' B'
  builder[0].descriptor(builder[1]);
  builder[1].describes(builder[0]);
  builder[2].descriptor(builder[3]);
  builder[3].describes(builder[2]);

  // A' A B B'
  builder[4].descriptor(builder[7]);
  builder[5].descriptor(builder[6]);
  builder[6].describes(builder[5]);
  builder[7].describes(builder[4]);

  auto translate = [&](HeapType t) -> HeapType {
    for (int i = 0; i < groupSize; ++i) {
      if (t == builder[i]) {
        return builder[2 * groupSize + i];
      }
    }
    WASM_UNREACHABLE("unexpected type");
  };

  // A B A' B' again
  builder[8].copy(builder[0], translate);
  builder[9].copy(builder[1], translate);
  builder[10].copy(builder[2], translate);
  builder[11].copy(builder[3], translate);

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0], built[8]);
  EXPECT_EQ(built[1], built[9]);
  EXPECT_EQ(built[2], built[10]);
  EXPECT_EQ(built[3], built[11]);

  EXPECT_NE(built[0].getRecGroup(), built[4].getRecGroup());
}